

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O3

int __thiscall asl::SocketServer::bind(SocketServer *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  AtomicCount *pAVar1;
  int iVar2;
  undefined4 in_register_00000034;
  char *****b;
  Socket server;
  SmartObject local_40;
  int local_38;
  int local_34;
  char ****local_30 [2];
  
  Socket::Socket((Socket *)&local_40);
  iVar2 = (*(local_40._p)->_vptr_SmartObject_[6])
                    (local_40._p,CONCAT44(in_register_00000034,__fd),(ulong)__addr & 0xffffffff);
  if ((char)iVar2 == '\0') {
    (*(local_40._p)->_vptr_SmartObject_[0x10])(&local_38);
    b = (char *****)local_30[0];
    if (local_38 == 0) {
      b = local_30;
    }
    String::assign(&this->_socketError,(char *)b,local_34);
    if (local_38 != 0) {
      free(local_30[0]);
    }
  }
  else {
    (*(local_40._p)->_vptr_SmartObject_[8])(local_40._p,0x28);
    Sockets::operator<<(&this->_sockets,(Socket *)&local_40);
  }
  if (local_40._p != (SmartObject_ *)0x0) {
    LOCK();
    pAVar1 = &(local_40._p)->rc;
    pAVar1->n = pAVar1->n + -1;
    UNLOCK();
    if ((pAVar1->n == 0) && (local_40._p != (SmartObject_ *)0x0)) {
      (*(local_40._p)->_vptr_SmartObject_[1])();
    }
  }
  return iVar2;
}

Assistant:

bool SocketServer::bind(const String& ip, int port)
{
	Socket server;
	if(server.bind(ip, port))
	{
		server.listen(40);
		_sockets << server;
		return true;
	}
	_socketError = server.errorMsg();
	return false;
}